

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O1

void writeHash2<unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,SeedType *seed,
               size_t n1,size_t n2,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> *layer1,
               string *hash_str,string map_name,string *default_value,bool nonKeyLookups)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort uVar2;
  ushort uVar3;
  uint16_t seed_00;
  pointer pBVar4;
  pointer puVar5;
  bool bVar6;
  _Alloc_hider _Var7;
  size_type sVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  long *plVar12;
  long lVar13;
  ulong uVar14;
  size_type *psVar15;
  char cVar16;
  size_t sVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  pointer pBVar21;
  size_type sVar22;
  string upper_name;
  string __str_1;
  string __str;
  vector<int,_std::allocator<int>_> mapping;
  string local_a8;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pBVar21 = (layer1->super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar4 = (layer1->super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar21 != pBVar4) {
    uVar11 = (long)pBVar4 - (long)pBVar21 >> 5;
    lVar13 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<writeHash2<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
              (pBVar21,pBVar4,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,__gnu_cxx::__ops::_Iter_comp_iter<writeHash2<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
              (pBVar21,pBVar4);
  }
  upper_name._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&mapping,n2 + 1,(value_type_conflict4 *)&upper_name,(allocator_type *)&__str_1);
  puVar5 = (keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)puVar5;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 1;
    uVar2 = *seed;
    pBVar21 = (layer1->
              super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar18 = 0;
    do {
      uVar3 = puVar5[lVar18];
      uVar20 = (uint)(ushort)(uVar3 >> 7 ^ uVar3);
      uVar19 = uVar20 * uVar2;
      uVar20 = pBVar21[(uVar19 >> 7 ^ uVar19) & (uint)n1].seed * uVar20;
      mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [(uVar20 >> 7 ^ uVar20) & (uint)n2] = (int)lVar18;
      lVar18 = lVar18 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar18);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,vals);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,*(long *)map_name._M_dataplus._M_p,
             *(long *)(map_name._M_dataplus._M_p + 8) + *(long *)map_name._M_dataplus._M_p);
  getCommonCodeGen<unsigned_short>
            (&upper_name,keys,&local_48,&mapping,n2,&local_a8,(bool)map_name.field_2._M_local_buf[0]
            );
  std::__cxx11::string::operator=((string *)hash_str,(string *)&upper_name);
  paVar1 = &upper_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)upper_name._M_dataplus._M_p != paVar1) {
    operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  uVar11 = n1 + 1;
  cVar16 = '\x01';
  if (9 < uVar11) {
    uVar14 = uVar11;
    cVar9 = '\x04';
    do {
      cVar16 = cVar9;
      if (uVar14 < 100) {
        cVar16 = cVar16 + -2;
        goto LAB_00112aab;
      }
      if (uVar14 < 1000) {
        cVar16 = cVar16 + -1;
        goto LAB_00112aab;
      }
      if (uVar14 < 10000) goto LAB_00112aab;
      bVar6 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar9 = cVar16 + '\x04';
    } while (bVar6);
    cVar16 = cVar16 + '\x01';
  }
LAB_00112aab:
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str,cVar16);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar11);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x1172ee);
  psVar15 = (size_type *)(plVar12 + 2);
  if ((size_type *)*plVar12 == psVar15) {
    __str_1.field_2._M_allocated_capacity = *psVar15;
    __str_1.field_2._8_8_ = plVar12[3];
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
  }
  else {
    __str_1.field_2._M_allocated_capacity = *psVar15;
    __str_1._M_dataplus._M_p = (pointer)*plVar12;
  }
  __str_1._M_string_length = plVar12[1];
  *plVar12 = (long)psVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&__str_1);
  psVar15 = (size_type *)(plVar12 + 2);
  if ((size_type *)*plVar12 == psVar15) {
    upper_name.field_2._M_allocated_capacity = *psVar15;
    upper_name.field_2._8_8_ = plVar12[3];
    upper_name._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    upper_name.field_2._M_allocated_capacity = *psVar15;
    upper_name._M_dataplus._M_p = (pointer)*plVar12;
  }
  upper_name._M_string_length = plVar12[1];
  *plVar12 = (long)psVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::string::_M_append((char *)hash_str,(ulong)upper_name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)upper_name._M_dataplus._M_p != paVar1) {
    operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  pBVar21 = (layer1->super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar4 = (layer1->super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar21 != pBVar4) {
    uVar11 = 0;
    lVar13 = 0;
    do {
      if ((lVar13 != 0) && (-lVar13 == (uVar11 / 5 & 0xfffffffffffffffe) * 5)) {
        std::__cxx11::string::append((char *)hash_str);
      }
      uVar2 = pBVar21->seed;
      uVar19 = 1;
      if (((9 < uVar2) && (uVar19 = 2, 99 < uVar2)) && (uVar19 = 3, 999 < uVar2)) {
        uVar19 = 5 - (uVar2 < 10000);
      }
      __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str_1,(char)uVar19);
      std::__detail::__to_chars_10_impl<unsigned_int>(__str_1._M_dataplus._M_p,uVar19,(uint)uVar2);
      plVar12 = (long *)std::__cxx11::string::append((char *)&__str_1);
      psVar15 = (size_type *)(plVar12 + 2);
      if ((size_type *)*plVar12 == psVar15) {
        upper_name.field_2._M_allocated_capacity = *psVar15;
        upper_name.field_2._8_8_ = plVar12[3];
        upper_name._M_dataplus._M_p = (pointer)&upper_name.field_2;
      }
      else {
        upper_name.field_2._M_allocated_capacity = *psVar15;
        upper_name._M_dataplus._M_p = (pointer)*plVar12;
      }
      upper_name._M_string_length = plVar12[1];
      *plVar12 = (long)psVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::_M_append((char *)hash_str,(ulong)upper_name._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)upper_name._M_dataplus._M_p != &upper_name.field_2) {
        operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
        operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
      }
      pBVar21 = pBVar21 + 1;
      uVar11 = uVar11 + 1;
      lVar13 = lVar13 + -1;
    } while (pBVar21 != pBVar4);
  }
  std::__cxx11::string::append((char *)hash_str);
  seed_00 = *seed;
  sVar17 = *(size_t *)map_name._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,sVar17,*(long *)(map_name._M_dataplus._M_p + 8) + sVar17);
  local_88.field_2._M_allocated_capacity = 0x745f3631746e6975;
  local_88._M_string_length = 8;
  local_88.field_2._M_local_buf[8] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  hashStr2(&upper_name,sVar17,seed_00,n1,n2,(string *)map_name._M_string_length,&local_68,&local_88,
           (bool)map_name.field_2._M_local_buf[0]);
  std::__cxx11::string::_M_append((char *)hash_str,(ulong)upper_name._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)upper_name._M_dataplus._M_p != &upper_name.field_2) {
    operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  upper_name._M_dataplus._M_p = (pointer)&upper_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&upper_name,*(long *)map_name._M_dataplus._M_p,
             *(long *)(map_name._M_dataplus._M_p + 8) + *(long *)map_name._M_dataplus._M_p);
  sVar8 = upper_name._M_string_length;
  _Var7._M_p = upper_name._M_dataplus._M_p;
  if (upper_name._M_string_length != 0) {
    sVar22 = 0;
    do {
      iVar10 = toupper((int)_Var7._M_p[sVar22]);
      _Var7._M_p[sVar22] = (char)iVar10;
      sVar22 = sVar22 + 1;
    } while (sVar8 != sVar22);
  }
  std::operator+(&__str,"#endif // POIFECT_",&upper_name);
  plVar12 = (long *)std::__cxx11::string::append((char *)&__str);
  psVar15 = (size_type *)(plVar12 + 2);
  if ((size_type *)*plVar12 == psVar15) {
    __str_1.field_2._M_allocated_capacity = *psVar15;
    __str_1.field_2._8_8_ = plVar12[3];
    __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
  }
  else {
    __str_1.field_2._M_allocated_capacity = *psVar15;
    __str_1._M_dataplus._M_p = (pointer)*plVar12;
  }
  __str_1._M_string_length = plVar12[1];
  *plVar12 = (long)psVar15;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  std::__cxx11::string::_M_append((char *)hash_str,(ulong)__str_1._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
    operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)upper_name._M_dataplus._M_p != &upper_name.field_2) {
    operator_delete(upper_name._M_dataplus._M_p,upper_name.field_2._M_allocated_capacity + 1);
  }
  if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void writeHash2(const std::vector<KeyType>& keys,
               const SeedType& seed,
               size_t n1,
               size_t n2,
               const std::vector<std::string>& vals,
               std::vector<Bin<KeyType>> layer1,
               std::string& hash_str,
               std::string map_name,
               const std::string& default_value,
               bool nonKeyLookups){

    struct LayerSort{
        inline bool operator() (const Bin<KeyType>& a, const Bin<KeyType>& b){
            return (a.generating_hash < b.generating_hash);
        }
    };
    std::sort(layer1.begin(), layer1.end(), LayerSort());

    std::vector<int> mapping(n2+1, -1);
    for(size_t i = 0; i < keys.size(); i++){
        const KeyType& key = keys[i];
        uint32_t h = hash2(key, seed) & n1;
        uint32_t s1 = layer1[h].seed;
        size_t final = hash2(key, s1) & n2;
        mapping[final] = i;
    }

    hash_str = getCommonCodeGen(keys, vals, mapping, n2, map_name, nonKeyLookups);

    hash_str += "    static constexpr std::array<uint16_t, " + std::to_string(n1+1) + "> seeds {\n        ";

    size_t i = 0;
    for(const auto& bin : layer1){
        if(i && i%entries_per_row==0) hash_str += "\n        ";
        i++;
        hash_str += std::to_string(bin.seed) + ",";
    }
    hash_str += "\n    };\n\n";

    hash_str += hashStr2(keys[0], seed, n1, n2, default_value, map_name, typeStr(keys[0]), nonKeyLookups);

    std::string upper_name = map_name;
    std::transform(upper_name.begin(), upper_name.end(), upper_name.begin(), toupper);
    hash_str += "#endif // POIFECT_" + upper_name + "_H\n";
}